

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O1

void __thiscall
amrex::Amr::Amr(Amr *this,RealBox *rb,int max_level_in,Vector<int,_std::allocator<int>_> *n_cell_in,
               int coord,LevelBld *a_levelbld)

{
  _Rb_tree_header *p_Var1;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_48;
  
  local_48.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  AmrCore::AmrCore(&this->super_AmrCore,rb,max_level_in,n_cell_in,coord,&local_48,(int *)0x0);
  if (local_48.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
      super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                    super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_AmrCore).super_AmrMesh._vptr_AmrMesh = (_func_int **)&PTR__Amr_00750ab8;
  (this->regrid_grids_file)._M_dataplus._M_p = (pointer)&(this->regrid_grids_file).field_2;
  (this->regrid_grids_file)._M_string_length = 0;
  (this->regrid_grids_file).field_2._M_local_buf[0] = '\0';
  (this->initial_grids_file)._M_dataplus._M_p = (pointer)&(this->initial_grids_file).field_2;
  (this->initial_grids_file)._M_string_length = 0;
  (this->initial_grids_file).field_2._M_local_buf[0] = '\0';
  (this->amr_level).
  super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
  .
  super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->amr_level).
  super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
  .
  super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->amr_level).
  super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
  .
  super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dt_level).super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->dt_level).super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->dt_level).super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->level_steps).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->level_steps).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->level_steps).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  (this->level_count).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->level_count).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->level_count).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  (this->n_cycle).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->n_cycle).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->n_cycle).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  (this->subcycling_mode)._M_dataplus._M_p = (pointer)&(this->subcycling_mode).field_2;
  (this->subcycling_mode)._M_string_length = 0;
  (this->subcycling_mode).field_2._M_local_buf[0] = '\0';
  (this->dt_min).super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->dt_min).super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->dt_min).super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->regrid_int).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  (this->regrid_int).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->regrid_int).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->check_file_root)._M_dataplus._M_p = (pointer)&(this->check_file_root).field_2;
  (this->check_file_root)._M_string_length = 0;
  (this->check_file_root).field_2._M_local_buf[0] = '\0';
  (this->plot_file_root)._M_dataplus._M_p = (pointer)&(this->plot_file_root).field_2;
  (this->plot_file_root)._M_string_length = 0;
  (this->plot_file_root).field_2._M_local_buf[0] = '\0';
  (this->small_plot_file_root)._M_dataplus._M_p = (pointer)&(this->small_plot_file_root).field_2;
  (this->small_plot_file_root)._M_string_length = 0;
  (this->small_plot_file_root).field_2._M_local_buf[0] = '\0';
  std::ofstream::ofstream(&this->gridlog);
  std::ofstream::ofstream(&this->runlog);
  std::ofstream::ofstream(&this->runlog_terse);
  (this->datalogname).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->datalogname).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->datalog).
  super_vector<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_std::allocator<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
  .
  super__Vector_base<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_std::allocator<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->datalogname).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->datalog).
  super_vector<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_std::allocator<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
  .
  super__Vector_base<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_std::allocator<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->datalog).
  super_vector<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_std::allocator<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
  .
  super__Vector_base<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_std::allocator<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->restart_chkfile)._M_dataplus._M_p = (pointer)&(this->restart_chkfile).field_2;
  (this->restart_chkfile)._M_string_length = 0;
  (this->restart_chkfile).field_2._M_local_buf[0] = '\0';
  (this->restart_pltfile)._M_dataplus._M_p = (pointer)&(this->restart_pltfile).field_2;
  (this->restart_pltfile)._M_string_length = 0;
  (this->restart_pltfile).field_2._M_local_buf[0] = '\0';
  (this->probin_file)._M_dataplus._M_p = (pointer)&(this->probin_file).field_2;
  (this->probin_file)._M_string_length = 0;
  (this->probin_file).field_2._M_local_buf[0] = '\0';
  this->levelbld = a_levelbld;
  p_Var1 = &(this->intersect_lox)._M_t._M_impl.super__Rb_tree_header;
  (this->intersect_lox)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->intersect_lox)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->intersect_lox)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->intersect_lox)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->intersect_lox)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->intersect_loy)._M_t._M_impl.super__Rb_tree_header;
  (this->intersect_loy)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->intersect_loy)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->intersect_loy)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->intersect_loy)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->intersect_loy)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->intersect_loz)._M_t._M_impl.super__Rb_tree_header;
  (this->intersect_loz)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->intersect_loz)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->intersect_loz)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->intersect_loz)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->intersect_loz)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->intersect_hix)._M_t._M_impl.super__Rb_tree_header;
  (this->intersect_hix)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->intersect_hix)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->intersect_hix)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->intersect_hix)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->intersect_hix)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->intersect_hiy)._M_t._M_impl.super__Rb_tree_header;
  (this->intersect_hiy)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->intersect_hiy)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->intersect_hiy)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->intersect_hiy)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->intersect_hiy)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->intersect_hiz)._M_t._M_impl.super__Rb_tree_header;
  (this->intersect_hiz)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->intersect_hiz)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->intersect_hiz)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->intersect_hiz)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->intersect_hiz)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  Initialize();
  InitAmr(this);
  return;
}

Assistant:

Amr::Amr (const RealBox* rb, int max_level_in, const Vector<int>& n_cell_in, int coord,
          LevelBld* a_levelbld)
    :
    AmrCore(rb,max_level_in,n_cell_in,coord),
    levelbld(a_levelbld)
{
    Initialize();
    InitAmr();
}